

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::MessageLite::OnDemandRegisterArenaDtor(MessageLite *this,Arena *arena)

{
  int iVar1;
  undefined4 extraout_var;
  LogMessage *pLVar2;
  LogMessage local_38;
  Voidify local_21;
  long local_20;
  ClassData *data;
  Arena *arena_local;
  MessageLite *this_local;
  
  if (arena != (Arena *)0x0) {
    data = (ClassData *)arena;
    arena_local = (Arena *)this;
    iVar1 = (*this->_vptr_MessageLite[4])();
    local_20 = CONCAT44(extraout_var,iVar1);
    if (local_20 == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message_lite.cc"
                 ,0x7b,"data != nullptr");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar2);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_38);
    }
    if (*(long *)(local_20 + 0x10) != 0) {
      (**(code **)(local_20 + 0x10))(this,data);
    }
  }
  return;
}

Assistant:

void MessageLite::OnDemandRegisterArenaDtor(Arena* arena) {
  if (arena == nullptr) return;
  auto* data = GetClassData();
  ABSL_DCHECK(data != nullptr);

  if (data->on_demand_register_arena_dtor != nullptr) {
    data->on_demand_register_arena_dtor(*this, *arena);
  }
}